

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::~Amr(Amr *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Amr_01803a38;
  (**(code **)(*(long *)in_RDI[0x12d] + 0x20))();
  Finalize();
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
               *)0x10e3307);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
               *)0x10e3318);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
               *)0x10e3329);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
               *)0x10e333a);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
               *)0x10e334b);
  std::
  multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~multimap((multimap<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
               *)0x10e335c);
  std::__cxx11::string::~string((string *)(in_RDI + 0x129));
  std::__cxx11::string::~string((string *)(in_RDI + 0x125));
  std::__cxx11::string::~string((string *)(in_RDI + 0x121));
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x10e33a0);
  Vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  ::~Vector((Vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
             *)0x10e33b1);
  std::ofstream::~ofstream(in_RDI + 0xda);
  std::ofstream::~ofstream(in_RDI + 0x9a);
  std::ofstream::~ofstream(in_RDI + 0x5a);
  std::__cxx11::string::~string((string *)(in_RDI + 0x54));
  std::__cxx11::string::~string((string *)(in_RDI + 0x50));
  std::__cxx11::string::~string((string *)(in_RDI + 0x43));
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10e3428);
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x10e3439);
  std::__cxx11::string::~string((string *)(in_RDI + 0x36));
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10e345b);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10e346c);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10e347d);
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x10e348e);
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::~Vector((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             *)0x10e349f);
  std::__cxx11::string::~string((string *)(in_RDI + 0x21));
  std::__cxx11::string::~string((string *)(in_RDI + 0x1d));
  AmrCore::~AmrCore((AmrCore *)0x10e34cb);
  return;
}

Assistant:

Amr::~Amr ()
{
    levelbld->variableCleanUp();

    Amr::Finalize();
}